

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGL.cpp
# Opt level: O3

char * a__GlPrintError(int error)

{
  switch(error) {
  case 0x500:
    return "GL_INVALID_ENUM";
  case 0x501:
    return "GL_INVALID_VALUE";
  case 0x502:
    return "GL_INVALID_OPERATION";
  case 0x503:
    return "GL_STACK_OVERFLOW";
  case 0x504:
    return "GL_STACK_UNDERFLOW";
  case 0x505:
    return "GL_OUT_OF_MEMORY";
  case 0x506:
    return "INVALID FRAMEBUFFER";
  }
  if (error != 0x8031) {
    return "UNKNOWN";
  }
  return "GL_TABLE_TOO_LARGE";
}

Assistant:

const char *a__GlPrintError(int error) {
	const char *errstr = "UNKNOWN";
	switch (error) {
	case GL_INVALID_ENUM: errstr = "GL_INVALID_ENUM"; break;
	case GL_INVALID_VALUE: errstr = "GL_INVALID_VALUE"; break;
	case GL_INVALID_OPERATION: errstr = "GL_INVALID_OPERATION"; break;
#ifdef GL_STACK_OVERFLOW
	case GL_STACK_OVERFLOW: errstr = "GL_STACK_OVERFLOW"; break;
#endif
#ifdef GL_STACK_UNDERFLOW
	case GL_STACK_UNDERFLOW: errstr = "GL_STACK_UNDERFLOW"; break;
#endif
	case GL_OUT_OF_MEMORY: errstr = "GL_OUT_OF_MEMORY"; break;
#ifdef GL_TABLE_TOO_LARGE
	case GL_TABLE_TOO_LARGE: errstr = "GL_TABLE_TOO_LARGE"; break;
#endif
	case 1286: errstr = "INVALID FRAMEBUFFER"; break;
	};
	return errstr;
}